

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O3

vector<Node_*,_std::allocator<Node_*>_> * __thiscall
State::RootNodes(vector<Node_*,_std::allocator<Node_*>_> *__return_storage_ptr__,State *this,
                string *err)

{
  pointer *pppNVar1;
  Node *pNVar2;
  iterator __position;
  pointer ppEVar3;
  pointer __args;
  pointer ppEVar4;
  
  (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppEVar4 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar3) {
    do {
      __args = ((*ppEVar4)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (__args != ((*ppEVar4)->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pNVar2 = *__args;
          if ((pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (pNVar2->out_edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        ((vector<Node*,std::allocator<Node*>> *)__return_storage_ptr__,__position,
                         __args);
            }
            else {
              *__position._M_current = pNVar2;
              pppNVar1 = &(__return_storage_ptr__->
                          super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppNVar1 = *pppNVar1 + 1;
            }
          }
          __args = __args + 1;
        } while (__args != ((*ppEVar4)->outputs_).
                           super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        ppEVar3 = (this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 != ppEVar3);
    if (((this->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
         super__Vector_impl_data._M_start != ppEVar3) &&
       ((__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (__return_storage_ptr__->super__Vector_base<Node_*,_std::allocator<Node_*>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x12ff63);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Node*> State::RootNodes(string* err) const {
  vector<Node*> root_nodes;
  // Search for nodes with no output.
  for (vector<Edge*>::const_iterator e = edges_.begin();
       e != edges_.end(); ++e) {
    for (vector<Node*>::const_iterator out = (*e)->outputs_.begin();
         out != (*e)->outputs_.end(); ++out) {
      if ((*out)->out_edges().empty())
        root_nodes.push_back(*out);
    }
  }

  if (!edges_.empty() && root_nodes.empty())
    *err = "could not determine root nodes of build graph";

  return root_nodes;
}